

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TDeletingArray
          (TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this)

{
  FOptionMenuItem *pFVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar3];
      if (pFVar1 != (FOptionMenuItem *)0x0) {
        (*(pFVar1->super_FListMenuItem)._vptr_FListMenuItem[1])();
        uVar2 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::~TArray
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}